

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgGeneratorState.hpp
# Opt level: O1

float rsg::anon_unknown_0::getWeight<rsg::AcosOp>
                (GeneratorState *state,ConstValueRangeAccess valueRange)

{
  float fVar1;
  
  fVar1 = 0.0;
  if (0.0 < state->m_programParams->trigonometricBaseWeight) {
    fVar1 = UnaryBuiltinVecFunc<rsg::GetUnaryBuiltinVecWeight<rsg::AcosOp>,_rsg::ComputeUnaryBuiltinVecRange<rsg::AcosOp>,_rsg::EvaluateUnaryBuiltinVec<rsg::AcosOp>_>
            ::getWeight(state,valueRange);
    fVar1 = fVar1 * state->m_programParams->trigonometricBaseWeight;
  }
  return fVar1;
}

Assistant:

const ProgramParameters&	getProgramParameters		(void) const	{ return m_programParams;	}